

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoElement.h.h
# Opt level: O2

void __thiscall
TPZGeoElement<pzgeom::TPZGeoTetrahedra,_pzrefine::TPZRefTetrahedra>::TPZGeoElement
          (TPZGeoElement<pzgeom::TPZGeoTetrahedra,_pzrefine::TPZRefTetrahedra> *this,void **vtt,
          TPZGeoMesh *DestMesh,
          TPZGeoElement<pzgeom::TPZGeoTetrahedra,_pzrefine::TPZRefTetrahedra> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  key_type_conflict1 *__k;
  void *pvVar1;
  iterator iVar2;
  mapped_type_conflict *pmVar3;
  mapped_type_conflict mVar4;
  long lVar5;
  
  TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>,vtt + 1,DestMesh,
             &cp->super_TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>,gl2lcNdMap,gl2lcElMap);
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>).super_TPZGeoEl = pvVar1;
  *(void **)((long)(this->super_TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>).fGeo.
                   super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
            *(long *)((long)pvVar1 + -0x60) + -0x48) = vtt[5];
  lVar5 = 0x1d0;
  do {
    if (lVar5 == 0x200) {
      return;
    }
    mVar4 = -1;
    if (*(long *)((long)(cp->super_TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>).fGeo.
                        super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes + lVar5 + -0x48
                 ) != -1) {
      __k = (key_type_conflict1 *)
            ((long)(cp->super_TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>).fGeo.
                   super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes + lVar5 + -0x48);
      iVar2 = std::
              _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
              ::find(&gl2lcElMap->_M_t,__k);
      if ((_Rb_tree_header *)iVar2._M_node == &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZGeoElement.h.h"
                   ,0xcf);
      }
      pmVar3 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               ::operator[](gl2lcElMap,__k);
      mVar4 = *pmVar3;
    }
    *(mapped_type_conflict *)
     ((long)(this->super_TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>).fGeo.
            super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes + lVar5 + -0x48) = mVar4;
    lVar5 = lVar5 + 8;
  } while( true );
}

Assistant:

TPZGeoElement<TGeo,TRef>::TPZGeoElement(TPZGeoMesh &DestMesh,
										const TPZGeoElement &cp,
										std::map<int64_t,int64_t> &gl2lcNdMap,
										std::map<int64_t,int64_t> &gl2lcElMap):
TPZRegisterClassId(&TPZGeoElement::ClassId),
TPZGeoElRefLess<TGeo>(DestMesh, cp, gl2lcNdMap, gl2lcElMap)
{
	int i, n = TRef::NSubEl;
	for(i = 0; i < n; i++)
	{
		if (cp.fSubEl[i] == -1)
		{
			this->fSubEl[i]=-1;
			continue;
		}
		if (gl2lcElMap.find(cp.fSubEl[i]) == gl2lcElMap.end())
		{
#ifdef PZ_LOG
            TPZLogger logger("pz.mesh.tpzgeoelement");

            if (logger.isDebugEnabled()) {
              std::stringstream sout;
              sout << "ERROR in - " << __PRETTY_FUNCTION__
                   << " subelement index is not in map from original to "
                      "clone indexes! Son index = "
                   << fSubEl[i];
              LOGPZ_ERROR(logger, sout.str().c_str());
            }
#endif
            DebugStop();
        }
		this->fSubEl[i] = gl2lcElMap[cp.fSubEl[i]];
	}
}